

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall
Minisat::Solver::analyze
          (Solver *this,CRef confl,vec<Minisat::Lit,_int> *out_learnt,int *out_btlevel)

{
  uint *puVar1;
  uint uVar2;
  Lit p;
  uint *puVar3;
  uint *puVar4;
  double *pdVar5;
  VarData *pVVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  Lit *pLVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  double dVar22;
  float fVar23;
  Lit q;
  Lit local_4c;
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *local_48;
  Size *local_40;
  int *local_38;
  
  uVar20 = (ulong)confl;
  local_38 = out_btlevel;
  vec<Minisat::Lit,_int>::push(out_learnt);
  iVar21 = (this->trail).sz + -1;
  local_48 = &this->order_heap;
  uVar9 = 0xfffffffe;
  iVar10 = 0;
  do {
    if ((uint)uVar20 == 0xffffffff) {
      __assert_fail("confl != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                    ,0x133,"void Minisat::Solver::analyze(CRef, vec<Lit> &, int &)");
    }
    if ((this->ca).ra.sz <= (uint)uVar20) goto LAB_00109809;
    puVar1 = (this->ca).ra.memory + uVar20;
    uVar14 = *puVar1;
    if ((uVar14 & 4) != 0) {
      if ((uVar14 & 8) == 0) {
LAB_00109828:
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                      ,0xd6,"float &Minisat::Clause::activity()");
      }
      dVar22 = this->cla_inc;
      fVar23 = (float)((double)(float)puVar1[(ulong)(uVar14 >> 5) + 1] + dVar22);
      puVar1[(ulong)(uVar14 >> 5) + 1] = (uint)fVar23;
      if (1e+20 < fVar23) {
        lVar11 = (long)(this->learnts).sz;
        if (0 < lVar11) {
          puVar3 = (this->learnts).data;
          puVar4 = (this->ca).ra.memory;
          uVar14 = (this->ca).ra.sz;
          lVar17 = 0;
          do {
            uVar2 = puVar3[lVar17];
            if (uVar14 <= uVar2) goto LAB_00109809;
            if ((puVar4[uVar2] & 8) == 0) goto LAB_00109828;
            uVar20 = (ulong)(puVar4[uVar2] >> 5);
            puVar4[(ulong)uVar2 + uVar20 + 1] =
                 (uint)((float)puVar4[(ulong)uVar2 + uVar20 + 1] * 1e-20);
            lVar17 = lVar17 + 1;
          } while (lVar11 != lVar17);
        }
        this->cla_inc = dVar22 * 1e-20;
      }
    }
    if ((uint)(uVar9 != 0xfffffffe) < *puVar1 >> 5) {
      uVar20 = (ulong)(uVar9 != 0xfffffffe);
      do {
        local_4c.x = puVar1[uVar20 + 1];
        iVar15 = local_4c.x >> 1;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar15)
        goto LAB_001097b4;
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar15] ==
            '\0') {
          if ((this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
              iVar15) goto LAB_001097ea;
          if (0 < (this->vardata).
                  super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                  data[iVar15].level) {
            uVar9 = (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.sz
            ;
            if ((int)uVar9 <= iVar15) {
LAB_001097cb:
              pcVar13 = 
              "V &Minisat::IntMap<int, double>::operator[](K) [K = int, V = double, MkIndex = Minisat::MkIndexDefault<int>]"
              ;
              goto LAB_001097e0;
            }
            pdVar5 = (this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>.map.
                     data;
            dVar22 = this->var_inc + pdVar5[iVar15];
            pdVar5[iVar15] = dVar22;
            if (1e+100 < dVar22) {
              iVar19 = this->next_var;
              if (0 < (long)iVar19) {
                uVar12 = (ulong)uVar9;
                if ((int)uVar9 < 1) {
                  uVar12 = 0;
                }
                uVar18 = 0;
                do {
                  if (uVar12 == uVar18) goto LAB_001097cb;
                  pdVar5[uVar18] = pdVar5[uVar18] * 1e-100;
                  uVar18 = uVar18 + 1;
                } while ((long)iVar19 != uVar18);
              }
              this->var_inc = this->var_inc * 1e-100;
            }
            if ((iVar15 < (this->order_heap).indices.map.sz) &&
               (-1 < (this->order_heap).indices.map.data[iVar15])) {
              Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::decrease
                        (local_48,iVar15);
            }
            iVar15 = local_4c.x >> 1;
            if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar15
               ) goto LAB_001097b4;
            (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar15] =
                 '\x01';
            if ((this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
                iVar15) goto LAB_001097ea;
            if ((this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
                [iVar15].level < (this->trail_lim).sz) {
              vec<Minisat::Lit,_int>::push(out_learnt,&local_4c);
            }
            else {
              iVar10 = iVar10 + 1;
            }
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < *puVar1 >> 5);
    }
    pcVar13 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    pLVar16 = (this->trail).data + iVar21;
    do {
      uVar9 = pLVar16->x;
      iVar15 = (int)uVar9 >> 1;
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar15)
      goto LAB_001097b4;
      pLVar16 = pLVar16 + -1;
      iVar21 = iVar21 + -1;
    } while (pcVar13[iVar15] == '\0');
    if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
        map.sz <= iVar15) goto LAB_001097ea;
    uVar20 = (ulong)(this->vardata).
                    super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                    data[iVar15].reason;
    pcVar13[iVar15] = '\0';
    bVar8 = 1 < iVar10;
    iVar10 = iVar10 + -1;
  } while (bVar8);
  out_learnt->data->x = uVar9 ^ 1;
  vec<Minisat::Lit,_int>::copyTo(out_learnt,&this->analyze_toclear);
  uVar9 = out_learnt->sz;
  if (this->ccmin_mode == 2) {
    uVar20 = 1;
    uVar14 = 1;
    if (1 < (int)uVar9) {
      uVar20 = 1;
      do {
        p.x = out_learnt->data[uVar20].x;
        iVar10 = p.x >> 1;
        if ((this->vardata).
            super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
            iVar10) goto LAB_001097ea;
        if (((this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
             [iVar10].reason == 0xffffffff) || (bVar8 = litRedundant(this,p), !bVar8)) {
          lVar11 = (long)(int)uVar14;
          uVar14 = uVar14 + 1;
          out_learnt->data[lVar11].x = out_learnt->data[uVar20].x;
        }
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)out_learnt->sz);
    }
  }
  else if (this->ccmin_mode == 1) {
    uVar20 = 1;
    uVar14 = 1;
    if (1 < (int)uVar9) {
      pLVar16 = out_learnt->data;
      pVVar6 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      local_48 = (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *)
                 (this->ca).ra.memory;
      local_40 = &(local_48->heap).sz;
      uVar20 = 1;
      do {
        iVar10 = pLVar16[uVar20].x;
        iVar15 = iVar10 >> 1;
        iVar21 = (this->vardata).
                 super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
        if (iVar21 <= iVar15) goto LAB_001097ea;
        uVar9 = pVVar6[iVar15].reason;
        uVar12 = (ulong)uVar9;
        if (uVar12 == 0xffffffff) {
LAB_00109617:
          lVar11 = (long)(int)uVar14;
          uVar14 = uVar14 + 1;
          pLVar16[lVar11].x = iVar10;
        }
        else {
          if ((this->ca).ra.sz <= uVar9) {
LAB_00109809:
            __assert_fail("r < sz",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                          ,0x3f,
                          "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                         );
          }
          uVar9 = *(uint *)((long)&(local_48->heap).data + uVar12 * 4);
          if (0x3f < uVar9) {
            lVar11 = 0;
            do {
              iVar15 = local_40[uVar12 + lVar11] >> 1;
              if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
                  iVar15) goto LAB_001097b4;
              if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
                  [iVar15] == '\0') {
                if (iVar21 <= iVar15) goto LAB_001097ea;
                if (0 < pVVar6[iVar15].level) goto LAB_00109617;
              }
              lVar11 = lVar11 + 1;
            } while ((ulong)(uVar9 >> 5) - 1 != lVar11);
          }
        }
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)out_learnt->sz);
    }
  }
  else {
    uVar20 = (ulong)uVar9;
    uVar14 = uVar9;
  }
  this->max_literals = this->max_literals + (long)out_learnt->sz;
  vec<Minisat::Lit,_int>::shrink(out_learnt,(int)uVar20 - uVar14);
  iVar10 = out_learnt->sz;
  lVar11 = (long)iVar10;
  this->tot_literals = this->tot_literals + lVar11;
  iVar21 = 0;
  if (lVar11 != 1) {
    lVar17 = 1;
    if (2 < iVar10) {
      iVar10 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
      pVVar6 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      iVar21 = 1;
      lVar17 = 2;
      do {
        iVar15 = out_learnt->data[lVar17].x >> 1;
        if ((iVar10 <= iVar15) || (iVar19 = out_learnt->data[iVar21].x >> 1, iVar10 <= iVar19))
        goto LAB_001097ea;
        iVar7 = (int)lVar17;
        if (pVVar6[iVar15].level <= pVVar6[iVar19].level) {
          iVar7 = iVar21;
        }
        iVar21 = iVar7;
        lVar17 = lVar17 + 1;
      } while (lVar11 != lVar17);
      lVar17 = (long)iVar21;
    }
    pLVar16 = out_learnt->data;
    iVar10 = pLVar16[lVar17].x;
    pLVar16[lVar17].x = pLVar16[1].x;
    pLVar16[1].x = iVar10;
    iVar10 = iVar10 >> 1;
    if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.
        map.sz <= iVar10) {
LAB_001097ea:
      __assert_fail("has(k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                    ,0x27,
                    "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                   );
    }
    iVar21 = (this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
             [iVar10].level;
  }
  *local_38 = iVar21;
  if (0 < (this->analyze_toclear).sz) {
    lVar11 = 0;
    do {
      iVar10 = (this->analyze_toclear).data[lVar11].x >> 1;
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar10) {
LAB_001097b4:
        pcVar13 = 
        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_001097e0:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,pcVar13);
      }
      (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar10] = '\0';
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->analyze_toclear).sz);
  }
  return;
}

Assistant:

void Solver::analyze(CRef confl, vec<Lit>& out_learnt, int& out_btlevel)
{
    int pathC = 0;
    Lit p     = lit_Undef;

    // Generate conflict clause:
    //
    out_learnt.push();      // (leave room for the asserting literal)
    int index   = trail.size() - 1;

    do{
        assert(confl != CRef_Undef); // (otherwise should be UIP)
        Clause& c = ca[confl];

        if (c.learnt())
            claBumpActivity(c);

        for (int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++){
            Lit q = c[j];

            if (!seen[var(q)] && level(var(q)) > 0){
                varBumpActivity(var(q));
                seen[var(q)] = 1;
                if (level(var(q)) >= decisionLevel())
                    pathC++;
                else
                    out_learnt.push(q);
            }
        }
        
        // Select next clause to look at:
        while (!seen[var(trail[index--])]);
        p     = trail[index+1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    }while (pathC > 0);
    out_learnt[0] = ~p;

    // Simplify conflict clause:
    //
    int i, j;
    out_learnt.copyTo(analyze_toclear);
    if (ccmin_mode == 2){
        for (i = j = 1; i < out_learnt.size(); i++)
            if (reason(var(out_learnt[i])) == CRef_Undef || !litRedundant(out_learnt[i]))
                out_learnt[j++] = out_learnt[i];
        
    }else if (ccmin_mode == 1){
        for (i = j = 1; i < out_learnt.size(); i++){
            Var x = var(out_learnt[i]);

            if (reason(x) == CRef_Undef)
                out_learnt[j++] = out_learnt[i];
            else{
                Clause& c = ca[reason(var(out_learnt[i]))];
                for (int k = 1; k < c.size(); k++)
                    if (!seen[var(c[k])] && level(var(c[k])) > 0){
                        out_learnt[j++] = out_learnt[i];
                        break; }
            }
        }
    }else
        i = j = out_learnt.size();

    max_literals += out_learnt.size();
    out_learnt.shrink(i - j);
    tot_literals += out_learnt.size();

    // Find correct backtrack level:
    //
    if (out_learnt.size() == 1)
        out_btlevel = 0;
    else{
        int max_i = 1;
        // Find the first literal assigned at the next-highest level:
        for (int i = 2; i < out_learnt.size(); i++)
            if (level(var(out_learnt[i])) > level(var(out_learnt[max_i])))
                max_i = i;
        // Swap-in this literal at index 1:
        Lit p             = out_learnt[max_i];
        out_learnt[max_i] = out_learnt[1];
        out_learnt[1]     = p;
        out_btlevel       = level(var(p));
    }

    for (int j = 0; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;    // ('seen[]' is now cleared)
}